

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StockPileTests.cpp
# Opt level: O0

void __thiscall
solitaire::piles::StockPileWithCardsTest_tryPullOutFirstCard_Test::TestBody
          (StockPileWithCardsTest_tryPullOutFirstCard_Test *this)

{
  bool bVar1;
  reference pvVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  char *pcVar4;
  undefined4 extraout_var_00;
  undefined1 extraout_DL;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *rhs;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
  *matcher;
  Cards *this_00;
  shared_ptr<solitaire::piles::StockPile> *this_01;
  AssertHelper local_f8;
  Message local_f0;
  _Optional_payload_base<unsigned_int> local_e8;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_2;
  Message local_c8;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
  local_c0;
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>_>
  local_a8;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_1;
  Message local_78 [3];
  _Storage<solitaire::cards::Card,_true> local_60;
  undefined4 local_58;
  _Storage<solitaire::cards::Card,_true> local_50;
  undefined4 local_48;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  __normal_iterator<solitaire::cards::Card_*,_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>
  local_28;
  const_iterator local_20;
  value_type local_18;
  value_type firstCard;
  StockPileWithCardsTest_tryPullOutFirstCard_Test *this_local;
  
  this_00 = &(this->super_StockPileWithCardsTest).pileCards;
  firstCard = (value_type)this;
  pvVar2 = std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::front
                     (this_00);
  local_18 = *pvVar2;
  local_28._M_current =
       (Card *)std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::begin
                         (this_00);
  __gnu_cxx::
  __normal_iterator<solitaire::cards::Card_const*,std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>
  ::__normal_iterator<solitaire::cards::Card*>
            ((__normal_iterator<solitaire::cards::Card_const*,std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>
              *)&local_20,&local_28);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::erase
                   (this_00,local_20);
  this_01 = &(this->super_StockPileWithCardsTest).super_EmptyStockPileTest.pile;
  peVar3 = std::
           __shared_ptr_access<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this_01);
  (*(peVar3->super_StockPile).super_Archiver._vptr_Archiver[4])();
  peVar3 = std::
           __shared_ptr_access<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this_01);
  local_60._0_4_ = (*(peVar3->super_StockPile).super_Archiver._vptr_Archiver[5])();
  local_60._M_value.suit = extraout_var;
  local_58 = CONCAT31(local_58._1_3_,extraout_DL);
  local_48 = local_58;
  local_50 = local_60;
  testing::internal::EqHelper::
  Compare<std::optional<solitaire::cards::Card>,_solitaire::cards::Card,_nullptr>
            ((EqHelper *)local_40,"pile->tryPullOutCard()","firstCard",
             (optional<solitaire::cards::Card> *)&local_50._M_value,&local_18);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(local_78);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/StockPileTests.cpp"
               ,0x51,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  testing::ContainerEq<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>
            (&local_c0,(testing *)&(this->super_StockPileWithCardsTest).pileCards,rhs);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
            (&local_a8,(internal *)&local_c0,matcher);
  peVar3 = std::
           __shared_ptr_access<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_StockPileWithCardsTest).super_EmptyStockPileTest.pile);
  (*(peVar3->super_StockPile).super_Archiver._vptr_Archiver[6])();
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
  ::operator()(local_90,(char *)&local_a8,
               (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
               "pile->getCards()");
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>_>
  ::~PredicateFormatterFromMatcher(&local_a8);
  testing::
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
  ::~PolymorphicMatcher(&local_c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/StockPileTests.cpp"
               ,0x52,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  peVar3 = std::
           __shared_ptr_access<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_StockPileWithCardsTest).super_EmptyStockPileTest.pile);
  local_e8._M_payload._M_value = (*(peVar3->super_StockPile).super_Archiver._vptr_Archiver[7])();
  local_e8._4_4_ = extraout_var_00;
  testing::internal::EqHelper::Compare<std::optional<unsigned_int>,_std::nullopt_t,_nullptr>
            ((EqHelper *)local_e0,"pile->getSelectedCardIndex()","std::nullopt",
             (optional<unsigned_int> *)&local_e8,(nullopt_t *)&std::nullopt);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/StockPileTests.cpp"
               ,0x53,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  return;
}

Assistant:

TEST_F(StockPileWithCardsTest, tryPullOutFirstCard) {
    const auto firstCard = pileCards.front();
    pileCards.erase(pileCards.begin());

    pile->trySelectNextCard();

    EXPECT_EQ(pile->tryPullOutCard(), firstCard);
    EXPECT_THAT(pile->getCards(), ContainerEq(pileCards));
    EXPECT_EQ(pile->getSelectedCardIndex(), std::nullopt);
}